

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O1

maybe<int,_void> * __thiscall
pstore::broker::gc_watch_thread::get_pid
          (maybe<int,_void> *__return_storage_ptr__,gc_watch_thread *this,string *path)

{
  const_iterator cVar1;
  type *ptVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mut_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&this->processes_,path);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->processes_).left_._M_t._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->valid_ = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
    __return_storage_ptr__->valid_ = false;
  }
  else {
    ptVar2 = (type *)bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
                     ::getr(&this->processes_,path);
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = *ptVar2;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

maybe<process_identifier> gc_watch_thread::get_pid (std::string const & path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (!processes_.presentl (path)) {
                return {};
            }
            return maybe<process_identifier>{processes_.getr (path)};
        }